

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Slice_x86_avx2::forward
          (Slice_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  int _elempack;
  Mat *src;
  ulong _elemsize;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  pointer pMVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  void *pvVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  void *pvVar24;
  long lVar25;
  void *pvVar26;
  undefined4 *puVar27;
  void *pvVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  int iVar32;
  void *pvVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  void *pvVar37;
  bool bVar38;
  undefined1 local_b8 [56];
  int local_80;
  size_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar2 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar5 = (ulong)_elempack;
  lVar36 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86_avx2[-3]);
  iVar11 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx2[-3]);
  if (uVar2 == 1) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar12 != 0) {
      iVar17 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = 0;
      lVar35 = 0;
      iVar32 = 0;
      uVar29 = 0;
      do {
        uVar10 = *(uint *)(lVar36 + uVar29 * 4);
        uVar6 = (ulong)uVar10;
        if (uVar10 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar17 * _elempack - iVar32) / (uVar13 + lVar35);
        }
        uVar10 = 1;
        if ((opt->use_packing_layout == true) &&
           (uVar10 = (uint)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          uVar10 = 8;
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar12),
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)uVar10),(ulong)uVar10 * (_elemsize / uVar5),uVar10,
                    opt->blob_allocator);
        pvVar33 = *(void **)((long)&pMVar9->data + lVar12);
        if (pvVar33 == (void *)0x0) {
          bVar38 = true;
        }
        else {
          bVar38 = (long)*(int *)((long)&pMVar9->c + lVar12) *
                   *(long *)((long)&pMVar9->cstep + lVar12) == 0;
        }
        if (bVar38) {
          return -100;
        }
        memcpy(pvVar33,(void *)((long)iVar32 * 4 + (long)src->data),
               (long)*(int *)((long)&pMVar9->w + lVar12) *
               *(long *)((long)&pMVar9->elemsize + lVar12));
        iVar32 = (int)uVar6 + iVar32;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar35 = lVar35 + -1;
        lVar12 = lVar12 + 0x48;
      } while (uVar29 < uVar13);
    }
  }
  iVar11 = (iVar11 >> 0x1f & uVar2) + iVar11;
  if ((uVar2 == 2) && (iVar11 == 0)) {
    iVar17 = src->w;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    bVar38 = lVar12 != 0;
    if (bVar38) {
      iVar32 = src->h;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar35 = 0;
      lVar12 = 0;
      iVar18 = 0;
      uVar29 = 0;
      do {
        uVar10 = *(uint *)(lVar36 + uVar29 * 4);
        uVar6 = (ulong)uVar10;
        if (uVar10 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar32 * _elempack - iVar18) / (uVar13 + lVar12);
        }
        lVar21 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar21 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          lVar21 = 8;
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar35),iVar17,
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)lVar21),lVar21 * (_elemsize / uVar5),(int)lVar21,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar35) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar35) * *(long *)((long)&pMVar9->cstep + lVar35) ==
            0) {
          return -100;
        }
        iVar18 = iVar18 + (int)uVar6;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar35 = lVar35 + 0x48;
        bVar38 = uVar29 < uVar13;
      } while (bVar38);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar32 = pMVar9->elempack;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar12 != 0) {
      lVar12 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      piVar8 = &pMVar9->elempack;
      do {
        if (*piVar8 < iVar32) {
          iVar32 = *piVar8;
        }
        piVar8 = piVar8 + 0x12;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    piVar8 = src->refcount;
    local_b8._0_8_ = src->data;
    local_b8._8_4_ = SUB84(src->refcount,0);
    local_b8._12_4_ = (undefined4)((ulong)src->refcount >> 0x20);
    local_b8._16_4_ = (undefined4)src->elemsize;
    local_b8._20_4_ = (undefined4)(src->elemsize >> 0x20);
    local_b8._24_4_ = src->elempack;
    local_b8._32_8_ = src->allocator;
    local_b8._40_4_ = src->dims;
    local_b8._44_4_ = src->w;
    local_b8._48_4_ = src->h;
    local_b8._52_4_ = src->d;
    local_80 = src->c;
    local_78 = src->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    if (iVar32 < _elempack) {
      convert_packing(src,(Mat *)local_b8,iVar32,opt);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      local_38 = (long)iVar17;
      lVar35 = (long)(iVar17 * 8) * 4;
      local_58 = (long)(iVar17 * 4) * 4 + 0xc;
      lVar12 = (long)(iVar17 * 4) * 4;
      local_70 = local_38 * 4;
      local_60 = (long)(iVar17 * 2) << 2;
      local_68 = (long)(iVar17 * 3) << 2;
      local_40 = (long)(iVar17 * 5) << 2;
      local_48 = (long)(iVar17 * 6) << 2;
      local_50 = (long)(iVar17 * 7) << 2;
      uVar13 = 0;
      pvVar33 = (void *)local_b8._0_8_;
      do {
        pMVar1 = pMVar9 + uVar13;
        if (((iVar32 == 4) && (pMVar9[uVar13].elempack == 8)) &&
           (iVar18 = pMVar1->h, 0 < (long)iVar18)) {
          pvVar14 = pMVar1->data;
          iVar34 = pMVar1->w;
          sVar3 = pMVar1->elemsize;
          lVar21 = 0;
          do {
            if (0 < iVar17) {
              lVar23 = 0;
              iVar20 = iVar17;
              do {
                *(undefined4 *)((long)pvVar14 + lVar23 * 2) =
                     *(undefined4 *)((long)pvVar33 + lVar23);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 4) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 4);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 8) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 8);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 0xc) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 0xc);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 0x10) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + local_58 + -0xc);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 0x14) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + local_58 + -8);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 0x18) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + local_58 + -4);
                *(undefined4 *)((long)pvVar14 + lVar23 * 2 + 0x1c) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + local_58);
                lVar23 = lVar23 + 0x10;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar35);
            lVar21 = lVar21 + 1;
            pvVar14 = (void *)((long)pvVar14 + (long)iVar34 * sVar3);
          } while (lVar21 != iVar18);
        }
        if (((iVar32 == 1) && (pMVar1->elempack == 8)) && (iVar18 = pMVar1->h, 0 < (long)iVar18)) {
          pvVar15 = pMVar1->data;
          iVar34 = pMVar1->w;
          lVar21 = local_70 + (long)pvVar33;
          lVar19 = (long)pvVar33 + local_60;
          lVar22 = (long)pvVar33 + local_68;
          pvVar14 = (void *)((long)pvVar33 + lVar12);
          lVar25 = (long)pvVar33 + local_40;
          lVar23 = local_48 + (long)pvVar33;
          lVar30 = local_50 + (long)pvVar33;
          sVar3 = pMVar1->elemsize;
          lVar7 = 0;
          do {
            if (0 < iVar17) {
              lVar16 = 0;
              iVar20 = iVar17;
              do {
                *(undefined4 *)((long)pvVar15 + lVar16 * 8) =
                     *(undefined4 *)((long)pvVar33 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 4) = *(undefined4 *)(lVar21 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 8) = *(undefined4 *)(lVar19 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 0xc) = *(undefined4 *)(lVar22 + lVar16)
                ;
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar14 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 0x14) =
                     *(undefined4 *)(lVar25 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 0x18) =
                     *(undefined4 *)(lVar23 + lVar16);
                *(undefined4 *)((long)pvVar15 + lVar16 * 8 + 0x1c) =
                     *(undefined4 *)(lVar30 + lVar16);
                lVar16 = lVar16 + 4;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar35);
            lVar7 = lVar7 + 1;
            lVar21 = lVar21 + lVar35;
            lVar19 = lVar19 + lVar35;
            lVar22 = lVar22 + lVar35;
            pvVar14 = (void *)((long)pvVar14 + lVar35);
            lVar25 = lVar25 + lVar35;
            lVar23 = lVar23 + lVar35;
            lVar30 = lVar30 + lVar35;
            pvVar15 = (void *)((long)pvVar15 + (long)iVar34 * sVar3);
          } while (lVar7 != iVar18);
        }
        iVar18 = pMVar1->elempack;
        if (((iVar32 == 1) && (iVar18 == 4)) && (iVar34 = pMVar1->h, 0 < (long)iVar34)) {
          pvVar14 = pMVar1->data;
          iVar20 = pMVar1->w;
          sVar3 = pMVar1->elemsize;
          lVar21 = local_68 + (long)pvVar33;
          lVar23 = local_60 + (long)pvVar33;
          lVar30 = local_70 + (long)pvVar33;
          lVar19 = 0;
          do {
            if (0 < iVar17) {
              puVar27 = (undefined4 *)((long)iVar20 * sVar3 * lVar19 + (long)pvVar14);
              lVar22 = 0;
              do {
                *puVar27 = *(undefined4 *)((long)pvVar33 + lVar22 * 4);
                puVar27[1] = *(undefined4 *)(lVar30 + lVar22 * 4);
                puVar27[2] = *(undefined4 *)(lVar23 + lVar22 * 4);
                puVar27[3] = *(undefined4 *)(lVar21 + lVar22 * 4);
                puVar27 = puVar27 + 4;
                lVar22 = lVar22 + 1;
              } while (iVar17 != (int)lVar22);
            }
            pvVar33 = (void *)((long)pvVar33 + lVar12);
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 + lVar12;
            lVar23 = lVar23 + lVar12;
            lVar30 = lVar30 + lVar12;
          } while (lVar19 != iVar34);
        }
        if (iVar32 == iVar18) {
          lVar21 = pMVar1->h * local_38;
          memcpy(pMVar1->data,pvVar33,pMVar1->elemsize * lVar21);
          pvVar33 = (void *)((long)pvVar33 + (long)(int)lVar21 * (long)pMVar1->elempack * 4);
        }
        uVar13 = uVar13 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    piVar8 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_b8._0_8_ != (void *)0x0) {
            free((void *)local_b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_b8._32_8_)[3])();
        }
      }
    }
    local_78 = 0;
    local_b8._0_8_ = (void *)0x0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._40_16_ = ZEXT816(0);
    local_80 = 0;
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar2 == 2) && (iVar11 == 1)) {
    uVar10 = src->h;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    bVar38 = lVar12 != 0;
    if (bVar38) {
      iVar17 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar35 = 0;
      lVar12 = 0;
      uVar29 = 0;
      iVar32 = 0;
      do {
        iVar18 = *(int *)(lVar36 + uVar29 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)((long)iVar17 - (long)iVar32) / (uVar13 + lVar12));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar35),iVar18,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar35) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar35) * *(long *)((long)&pMVar9->cstep + lVar35) ==
            0) {
          return -100;
        }
        iVar32 = iVar32 + iVar18;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar35 = lVar35 + 0x48;
        bVar38 = uVar29 < uVar13;
      } while (bVar38);
    }
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar9) {
          pvVar33 = (void *)((long)src->w * uVar13 * src->elemsize + (long)src->data);
          lVar12 = 0x2c;
          uVar29 = 0;
          do {
            lVar35 = (long)*(int *)((long)&pMVar9->data + lVar12);
            memcpy((void *)(uVar13 * lVar35 * *(long *)((long)pMVar9 + lVar12 + -0x1c) +
                           *(long *)((long)pMVar9 + lVar12 + -0x2c)),pvVar33,lVar35 * _elemsize);
            pvVar33 = (void *)((long)pvVar33 +
                              (long)*(int *)((long)&pMVar9->data + lVar12) * uVar5 * 4);
            uVar29 = uVar29 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x48;
          } while (uVar29 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
    }
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar11 == 0)) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    bVar38 = lVar12 != 0;
    if (bVar38) {
      iVar17 = src->w;
      iVar32 = src->h;
      iVar18 = src->c;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar35 = 0;
      lVar12 = 0;
      uVar29 = 0;
      iVar34 = 0;
      do {
        uVar10 = *(uint *)(lVar36 + uVar29 * 4);
        uVar6 = (ulong)uVar10;
        if (uVar10 == 0xffffff17) {
          uVar6 = (ulong)(long)(iVar18 * _elempack - iVar34) / (uVar13 + lVar12);
        }
        lVar21 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar21 = (ulong)((uVar6 & 3) == 0) * 3 + 1, (uVar6 & 7) == 0)) {
          lVar21 = 8;
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar35),iVar17,iVar32,
                    (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)(int)lVar21),lVar21 * (_elemsize / uVar5),(int)lVar21,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar35) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar35) * *(long *)((long)&pMVar9->cstep + lVar35) ==
            0) {
          return -100;
        }
        iVar34 = iVar34 + (int)uVar6;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar35 = lVar35 + 0x48;
        bVar38 = uVar29 < uVar13;
      } while (bVar38);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = pMVar9->elempack;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar12 != 0) {
      lVar12 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      piVar8 = &pMVar9->elempack;
      do {
        if (*piVar8 < iVar17) {
          iVar17 = *piVar8;
        }
        piVar8 = piVar8 + 0x12;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    piVar8 = src->refcount;
    local_b8._0_8_ = src->data;
    local_b8._8_4_ = SUB84(src->refcount,0);
    local_b8._12_4_ = (undefined4)((ulong)src->refcount >> 0x20);
    local_b8._16_4_ = (undefined4)src->elemsize;
    local_b8._20_4_ = (undefined4)(src->elemsize >> 0x20);
    local_b8._24_4_ = src->elempack;
    local_b8._32_8_ = src->allocator;
    local_b8._40_4_ = src->dims;
    local_b8._44_4_ = src->w;
    local_b8._48_4_ = src->h;
    local_b8._52_4_ = src->d;
    local_80 = src->c;
    local_78 = src->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    if (iVar17 < _elempack) {
      convert_packing(src,(Mat *)local_b8,iVar17,opt);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      uVar13 = 0;
      uVar29 = 0;
      do {
        pMVar1 = pMVar9 + uVar13;
        if (((iVar17 == 4) && (pMVar9[uVar13].elempack == 8)) &&
           (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          lVar12 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          uVar29 = (ulong)(int)uVar29;
          pvVar14 = (void *)((uVar29 + 1) * lVar12 + local_b8._0_8_);
          pvVar33 = (void *)(lVar12 * uVar29 + local_b8._0_8_);
          lVar35 = 0;
          do {
            if (0 < iVar18) {
              lVar21 = pMVar1->cstep * pMVar1->elemsize * lVar35;
              pvVar15 = pMVar1->data;
              lVar23 = 0;
              iVar34 = iVar18;
              do {
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21) =
                     *(undefined4 *)((long)pvVar33 + lVar23);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 4) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 4);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 8) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 8);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 0xc) =
                     *(undefined4 *)((long)pvVar33 + lVar23 + 0xc);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 0x10) =
                     *(undefined4 *)((long)pvVar14 + lVar23);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 0x14) =
                     *(undefined4 *)((long)pvVar14 + lVar23 + 4);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 0x18) =
                     *(undefined4 *)((long)pvVar14 + lVar23 + 8);
                *(undefined4 *)((long)pvVar15 + lVar23 * 2 + lVar21 + 0x1c) =
                     *(undefined4 *)((long)pvVar14 + lVar23 + 0xc);
                lVar23 = lVar23 + 0x10;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar29 = uVar29 + 2;
            lVar35 = lVar35 + 1;
            pvVar14 = (void *)((long)pvVar14 + lVar12 * 2);
            pvVar33 = (void *)((long)pvVar33 + lVar12 * 2);
          } while (lVar35 != iVar32);
        }
        if (((iVar17 == 1) && (pMVar1->elempack == 8)) && (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          uVar29 = (ulong)(int)uVar29;
          lVar35 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          pvVar14 = (void *)((uVar29 + 7) * lVar35 + local_b8._0_8_);
          lVar12 = lVar35 * 8;
          pvVar15 = (void *)((uVar29 + 6) * lVar35 + local_b8._0_8_);
          pvVar24 = (void *)((uVar29 + 5) * lVar35 + local_b8._0_8_);
          pvVar26 = (void *)((uVar29 + 4) * lVar35 + local_b8._0_8_);
          pvVar28 = (void *)((uVar29 + 3) * lVar35 + local_b8._0_8_);
          pvVar37 = (void *)((uVar29 + 2) * lVar35 + local_b8._0_8_);
          pvVar31 = (void *)((uVar29 + 1) * lVar35 + local_b8._0_8_);
          pvVar33 = (void *)(lVar35 * uVar29 + local_b8._0_8_);
          lVar35 = 0;
          do {
            if (0 < iVar18) {
              lVar23 = pMVar1->cstep * pMVar1->elemsize * lVar35;
              pvVar4 = pMVar1->data;
              lVar21 = 0;
              iVar34 = iVar18;
              do {
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23) =
                     *(undefined4 *)((long)pvVar33 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 4) =
                     *(undefined4 *)((long)pvVar31 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 8) =
                     *(undefined4 *)((long)pvVar37 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 0xc) =
                     *(undefined4 *)((long)pvVar28 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 0x10) =
                     *(undefined4 *)((long)pvVar26 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 0x14) =
                     *(undefined4 *)((long)pvVar24 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 0x18) =
                     *(undefined4 *)((long)pvVar15 + lVar21);
                *(undefined4 *)((long)pvVar4 + lVar21 * 8 + lVar23 + 0x1c) =
                     *(undefined4 *)((long)pvVar14 + lVar21);
                lVar21 = lVar21 + 4;
                iVar34 = iVar34 + -1;
              } while (iVar34 != 0);
            }
            uVar29 = uVar29 + 8;
            lVar35 = lVar35 + 1;
            pvVar14 = (void *)((long)pvVar14 + lVar12);
            pvVar15 = (void *)((long)pvVar15 + lVar12);
            pvVar24 = (void *)((long)pvVar24 + lVar12);
            pvVar26 = (void *)((long)pvVar26 + lVar12);
            pvVar28 = (void *)((long)pvVar28 + lVar12);
            pvVar37 = (void *)((long)pvVar37 + lVar12);
            pvVar31 = (void *)((long)pvVar31 + lVar12);
            pvVar33 = (void *)((long)pvVar33 + lVar12);
          } while (lVar35 != iVar32);
        }
        if (((iVar17 == 1) && (pMVar1->elempack == 4)) && (iVar32 = pMVar1->c, 0 < (long)iVar32)) {
          iVar18 = pMVar1->h * pMVar1->w;
          uVar29 = (ulong)(int)uVar29;
          lVar35 = local_78 * CONCAT44(local_b8._20_4_,local_b8._16_4_);
          pvVar14 = (void *)((uVar29 + 3) * lVar35 + local_b8._0_8_);
          lVar12 = lVar35 * 4;
          pvVar15 = (void *)((uVar29 + 2) * lVar35 + local_b8._0_8_);
          pvVar24 = (void *)((uVar29 + 1) * lVar35 + local_b8._0_8_);
          pvVar33 = (void *)(lVar35 * uVar29 + local_b8._0_8_);
          lVar35 = 0;
          do {
            if (0 < iVar18) {
              puVar27 = (undefined4 *)
                        (pMVar1->cstep * lVar35 * pMVar1->elemsize + (long)pMVar1->data);
              lVar21 = 0;
              do {
                *puVar27 = *(undefined4 *)((long)pvVar33 + lVar21 * 4);
                puVar27[1] = *(undefined4 *)((long)pvVar24 + lVar21 * 4);
                puVar27[2] = *(undefined4 *)((long)pvVar15 + lVar21 * 4);
                puVar27[3] = *(undefined4 *)((long)pvVar14 + lVar21 * 4);
                puVar27 = puVar27 + 4;
                lVar21 = lVar21 + 1;
              } while (iVar18 != (int)lVar21);
            }
            uVar29 = uVar29 + 4;
            lVar35 = lVar35 + 1;
            pvVar14 = (void *)((long)pvVar14 + lVar12);
            pvVar15 = (void *)((long)pvVar15 + lVar12);
            pvVar24 = (void *)((long)pvVar24 + lVar12);
            pvVar33 = (void *)((long)pvVar33 + lVar12);
          } while (lVar35 != iVar32);
        }
        if (iVar17 == pMVar1->elempack) {
          memcpy(pMVar1->data,
                 (void *)(local_78 * (long)(int)uVar29 * CONCAT44(local_b8._20_4_,local_b8._16_4_) +
                         local_b8._0_8_),(long)((int)pMVar1->cstep * pMVar1->c) * pMVar1->elemsize);
          uVar29 = (ulong)(uint)((int)uVar29 + pMVar1->c);
        }
        uVar13 = uVar13 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    piVar8 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_b8._0_8_ != (void *)0x0) {
            free((void *)local_b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_b8._32_8_)[3])();
        }
      }
    }
    local_78 = 0;
    local_b8._0_8_ = (void *)0x0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._40_16_ = ZEXT816(0);
    local_80 = 0;
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar11 == 1)) {
    uVar10 = src->c;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    bVar38 = lVar12 != 0;
    if (bVar38) {
      iVar17 = src->w;
      iVar32 = src->h;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar35 = 0;
      lVar12 = 0;
      uVar29 = 0;
      iVar18 = 0;
      do {
        iVar34 = *(int *)(lVar36 + uVar29 * 4);
        if (iVar34 == -0xe9) {
          iVar34 = (int)((ulong)((long)iVar32 - (long)iVar18) / (uVar13 + lVar12));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar35),iVar17,iVar34,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar35) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar35) * *(long *)((long)&pMVar9->cstep + lVar35) ==
            0) {
          return -100;
        }
        iVar18 = iVar18 + iVar34;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar35 = lVar35 + 0x48;
        bVar38 = uVar29 < uVar13;
      } while (bVar38);
    }
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar9) {
          pvVar33 = (void *)(src->cstep * uVar13 * src->elemsize + (long)src->data);
          lVar12 = 0x40;
          uVar29 = 0;
          do {
            lVar35 = (long)*(int *)((long)pMVar9 + lVar12 + -0x10) *
                     (long)*(int *)((long)pMVar9 + lVar12 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar9->data + lVar12) * uVar13 *
                            *(long *)((long)pMVar9 + lVar12 + -0x30) +
                           *(long *)((long)pMVar9 + lVar12 + -0x40)),pvVar33,lVar35 * _elemsize);
            pvVar33 = (void *)((long)pvVar33 + (long)((int)lVar35 * _elempack) * 4);
            uVar29 = uVar29 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x48;
          } while (uVar29 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
    }
    if (bVar38) {
      return -100;
    }
  }
  if ((uVar2 == 3) && (iVar11 == 2)) {
    uVar2 = src->h;
    uVar10 = src->c;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    bVar38 = lVar12 != 0;
    if (bVar38) {
      iVar11 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = 0;
      lVar35 = 0;
      uVar29 = 0;
      iVar17 = 0;
      do {
        iVar32 = *(int *)(lVar36 + uVar29 * 4);
        if (iVar32 == -0xe9) {
          iVar32 = (int)((ulong)((long)iVar11 - (long)iVar17) / (uVar13 + lVar35));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar12),iVar32,uVar2,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar12) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar12) * *(long *)((long)&pMVar9->cstep + lVar12) ==
            0) {
          return -100;
        }
        iVar17 = iVar17 + iVar32;
        uVar29 = uVar29 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar35 = lVar35 + -1;
        lVar12 = lVar12 + 0x48;
        bVar38 = uVar29 < uVar13;
      } while (bVar38);
    }
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar33 = (void *)(src->cstep * uVar13 * src->elemsize + (long)src->data);
          uVar29 = 0;
          do {
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar9) {
              lVar36 = 0x40;
              uVar6 = 0;
              do {
                lVar12 = *(long *)((long)pMVar9 + lVar36 + -0x30);
                lVar35 = (long)*(int *)((long)pMVar9 + lVar36 + -0x14);
                memcpy((void *)(lVar12 * uVar29 * lVar35 +
                               *(long *)((long)&pMVar9->data + lVar36) * uVar13 * lVar12 +
                               *(long *)((long)pMVar9 + lVar36 + -0x40)),pvVar33,lVar35 * _elemsize)
                ;
                pvVar33 = (void *)((long)pvVar33 +
                                  (long)*(int *)((long)pMVar9 + lVar36 + -0x14) * uVar5 * 4);
                uVar6 = uVar6 + 1;
                pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar36 = lVar36 + 0x48;
              } while (uVar6 < (ulong)(((long)(top_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar2);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
    }
    if (bVar38) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}